

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O0

int __thiscall ON_ClippingRegion::InViewFrustum(ON_ClippingRegion *this,int count,ON_4dPoint *p)

{
  double dVar1;
  double dVar2;
  int local_50;
  uint local_4c;
  int i;
  uint some_out;
  uint all_out;
  uint out;
  double w;
  double x;
  double *cv;
  double *xform;
  ON_4dPoint *p_local;
  int count_local;
  ON_ClippingRegion *this_local;
  
  local_4c = 0;
  i = -1;
  local_50 = count;
  x = (double)p;
  while (local_50 != 0) {
    some_out = 0;
    dVar1 = (this->m_xform).m_xform[3][3] * *(double *)((long)x + 0x18) +
            (this->m_xform).m_xform[3][2] * *(double *)((long)x + 0x10) +
            (this->m_xform).m_xform[3][0] * *(double *)x +
            (this->m_xform).m_xform[3][1] * *(double *)((long)x + 8);
    dVar2 = (this->m_xform).m_xform[0][3] * *(double *)((long)x + 0x18) +
            (this->m_xform).m_xform[0][2] * *(double *)((long)x + 0x10) +
            (this->m_xform).m_xform[0][0] * *(double *)x +
            (this->m_xform).m_xform[0][1] * *(double *)((long)x + 8);
    if (-dVar1 <= dVar2) {
      if (dVar1 < dVar2) {
        some_out = 2;
      }
    }
    else {
      some_out = 1;
    }
    dVar2 = (this->m_xform).m_xform[1][3] * *(double *)((long)x + 0x18) +
            (this->m_xform).m_xform[1][2] * *(double *)((long)x + 0x10) +
            (this->m_xform).m_xform[1][0] * *(double *)x +
            (this->m_xform).m_xform[1][1] * *(double *)((long)x + 8);
    if (-dVar1 <= dVar2) {
      if (dVar1 < dVar2) {
        some_out = some_out | 8;
      }
    }
    else {
      some_out = some_out | 4;
    }
    dVar2 = (this->m_xform).m_xform[2][3] * *(double *)((long)x + 0x18) +
            (this->m_xform).m_xform[2][2] * *(double *)((long)x + 0x10) +
            (this->m_xform).m_xform[2][0] * *(double *)x +
            (this->m_xform).m_xform[2][1] * *(double *)((long)x + 8);
    if (-dVar1 <= dVar2) {
      if (dVar1 < dVar2) {
        some_out = some_out | 0x20;
      }
    }
    else {
      some_out = some_out | 0x10;
    }
    local_4c = some_out | local_4c;
    i = some_out & i;
    if ((local_4c != 0) && (i == 0)) break;
    x = (double)((long)x + 0x20);
    local_50 = local_50 + -1;
  }
  if (i == 0) {
    if (local_4c == 0) {
      local_50 = 2;
    }
    else {
      local_50 = 1;
    }
  }
  else {
    local_50 = 0;
  }
  return local_50;
}

Assistant:

int ON_ClippingRegion::InViewFrustum( 
  int count, 
  const ON_4dPoint* p
  ) const
{
  const double* xform;
  const double* cv;
  double x, w;
  unsigned int out, all_out, some_out;
  int i;

  some_out = 0;
  all_out  = 0xFFFFFFFF;
  xform = &m_xform.m_xform[0][0];
  cv = &p[0].x;
  for ( i = count; i--; cv += 4 )
  {
    out = 0;
    w = xform[12]*cv[0] + xform[13]*cv[1] + xform[14]*cv[2] + xform[15]*cv[3];
    x = xform[0]*cv[0] + xform[1]*cv[1] + xform[2]*cv[2] + xform[3]*cv[3];
    if (x < -w) out  = 0x01; else if (x > w) out  = 0x02;
    x = xform[4]*cv[0] + xform[5]*cv[1] + xform[6]*cv[2] + xform[7]*cv[3];
    if (x < -w) out |= 0x04; else if (x > w) out |= 0x08;
    x = xform[8]*cv[0] + xform[9]*cv[1] + xform[10]*cv[2] + xform[11]*cv[3];
    if (x < -w) out |= 0x10; else if (x > w) out |= 0x20;
    some_out |= out;
    all_out  &= out;
    if ( some_out && !all_out )
    {
      //  no further "out" checking is necessary
      break;
    }
  }

  if ( all_out )
    i = 0;
  else if ( some_out )
    i = 1;
  else
    i = 2;

  return i;
}